

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack21_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x200000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xb;
  *puVar1 = (in[2] - base) * 0x400 | *puVar1;
  *puVar1 = (in[3] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 1;
  *puVar1 = (in[4] - base) * 0x100000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] - base >> 0xc;
  *puVar1 = (in[5] - base) * 0x200 | *puVar1;
  *puVar1 = (in[6] - base) * 0x40000000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] - base >> 2;
  *puVar1 = (in[7] - base) * 0x80000 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[7] - base >> 0xd;
  *puVar1 = (in[8] - base) * 0x100 | *puVar1;
  *puVar1 = (in[9] - base) * 0x20000000 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[9] - base >> 3;
  *puVar1 = (in[10] - base) * 0x40000 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[10] - base >> 0xe;
  *puVar1 = (in[0xb] - base) * 0x80 | *puVar1;
  *puVar1 = (in[0xc] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xc] - base >> 4;
  *puVar1 = (in[0xd] - base) * 0x20000 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xd] - base >> 0xf;
  *puVar1 = (in[0xe] - base) * 0x40 | *puVar1;
  *puVar1 = (in[0xf] - base) * 0x8000000 | *puVar1;
  out[10] = in[0xf] - base >> 5;
  return out + 0xb;
}

Assistant:

uint32_t * pack21_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  16 );
    ++in;

    return out + 1;
}